

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void fe::operations::
     applyOperationT<fe::operations::op_unpremultipliedAlpha,fe::PixelR8G8B8A8,fe::PixelDISTANCE>
               (op_unpremultipliedAlpha *op,PixelR8G8B8A8 *srcPixelFormat,
               PixelDISTANCE *destPixelFormat,ImageData *src,ImageData *dest)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  uchar *srcLine;
  uint8_t *puVar8;
  uchar *destLine;
  uint8_t *puVar9;
  
  bVar3 = check(src,dest);
  if (bVar3) {
    puVar4 = (src->super_fe_image).data;
    puVar5 = (dest->super_fe_image).data;
    iVar1 = (dest->super_fe_image).w;
    iVar2 = (dest->super_fe_image).h;
    for (iVar6 = 0; puVar8 = puVar4, puVar9 = puVar5, iVar7 = iVar1, iVar6 != iVar2;
        iVar6 = iVar6 + 1) {
      while (iVar7 != 0) {
        *puVar9 = puVar8[3];
        puVar8 = puVar8 + (src->super_fe_image).bytespp;
        puVar9 = puVar9 + (dest->super_fe_image).bytespp;
        iVar7 = iVar7 + -1;
      }
      puVar4 = puVar4 + (src->super_fe_image).pitch;
      puVar5 = puVar5 + (dest->super_fe_image).pitch;
    }
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }